

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

BOOL __thiscall
Js::TypedArray<double,_false,_false>::DirectSetItemAtRange
          (TypedArray<double,_false,_false> *this,TypedArray<double,_false,_false> *fromArray,
          int32 iSrcStart,int32 iDstStart,uint32 length,_func_double_Var_ScriptContext_ptr *convFunc
          )

{
  Type puVar1;
  Type puVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar8;
  ScriptContext *pSVar9;
  double dVar10;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_84;
  uint local_80;
  uint local_6c;
  uint32 i;
  double undefinedValue;
  size_t byteSize;
  uint32 srcLength;
  uint32 dstLength;
  uint32 start;
  double *srcBuffer;
  double *dstBuffer;
  _func_double_Var_ScriptContext_ptr *convFunc_local;
  uint32 length_local;
  int32 iDstStart_local;
  int32 iSrcStart_local;
  TypedArray<double,_false,_false> *fromArray_local;
  TypedArray<double,_false,_false> *this_local;
  
  puVar1 = (this->super_TypedArrayBase).buffer;
  puVar2 = (fromArray->super_TypedArrayBase).buffer;
  if ((puVar2 == (Type)0x0) || (puVar1 == (Type)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x156,"(srcBuffer && dstBuffer)","srcBuffer && dstBuffer");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (0xfffffff < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x157,
                                "(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName))",
                                "length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (iSrcStart != iDstStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x159,"(iSrcStart == iDstStart)","iSrcStart == iDstStart");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar4 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if ((!bVar4) &&
     (bVar4 = Js::TypedArrayBase::IsDetachedBuffer(&fromArray->super_TypedArrayBase), !bVar4)) {
    srcLength = iDstStart;
    convFunc_local._4_4_ = length;
    if (iDstStart < 0) {
      if ((long)((ulong)length + (long)iDstStart) < 0) {
        return 1;
      }
      convFunc_local._4_4_ = iDstStart + length;
      srcLength = 0;
    }
    uVar5 = UInt32Math::Add(srcLength,convFunc_local._4_4_);
    uVar6 = ArrayObject::GetLength((ArrayObject *)this);
    if (uVar5 < uVar6) {
      local_80 = convFunc_local._4_4_;
    }
    else {
      uVar5 = ArrayObject::GetLength((ArrayObject *)this);
      if (srcLength < uVar5) {
        uVar5 = ArrayObject::GetLength((ArrayObject *)this);
        local_84 = uVar5 - srcLength;
      }
      else {
        local_84 = 0;
      }
      local_80 = local_84;
    }
    uVar5 = ArrayObject::GetLength((ArrayObject *)fromArray);
    if (srcLength + convFunc_local._4_4_ < uVar5) {
      local_8c = convFunc_local._4_4_;
    }
    else {
      uVar5 = ArrayObject::GetLength((ArrayObject *)fromArray);
      if (srcLength < uVar5) {
        uVar5 = ArrayObject::GetLength((ArrayObject *)fromArray);
        local_90 = uVar5 - srcLength;
      }
      else {
        local_90 = 0;
      }
      local_8c = local_90;
    }
    if (convFunc_local._4_4_ < local_8c) {
      if (convFunc_local._4_4_ < local_80) {
        local_94 = convFunc_local._4_4_;
      }
      else {
        local_94 = local_80;
      }
      local_98 = local_94;
    }
    else {
      if (local_8c < local_80) {
        local_9c = local_8c;
      }
      else {
        local_9c = local_80;
      }
      local_98 = local_9c;
    }
    if ((ulong)local_98 << 3 < (ulong)local_98) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x175,"(byteSize >= length)","byteSize >= length");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    js_memcpy_s(puVar1 + (ulong)srcLength * 8,(ulong)local_80 << 3,puVar2 + (ulong)srcLength * 8,
                (ulong)local_98 << 3);
    if (local_98 < local_80) {
      this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar8 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      dVar10 = (*convFunc)(pRVar8,pSVar9);
      for (local_6c = local_98; local_6c < local_80; local_6c = local_6c + 1) {
        *(double *)(puVar1 + (ulong)local_6c * 8) = dVar10;
      }
    }
    return 1;
  }
  pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL DirectSetItemAtRange(TypedArray *fromArray, __in int32 iSrcStart, __in int32 iDstStart, __in uint32 length, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName* dstBuffer = (TypeName*)buffer;
            TypeName* srcBuffer = (TypeName*)fromArray->buffer;
            Assert(srcBuffer && dstBuffer);
            Assert(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName));
            // caller checks that src and dst index are the same
            Assert(iSrcStart == iDstStart);

            if (this->IsDetachedBuffer() || fromArray->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            // Fixup destination start in case it's negative
            uint32 start = iDstStart;
            if (iDstStart < 0)
            {
                if ((int64)(length) + iDstStart < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }

                length += iDstStart;
                start = 0;
            }

            uint32 dstLength = UInt32Math::Add(start, length) < GetLength() ? length : GetLength() > start ? GetLength() - start : 0;
            uint32 srcLength = start + length < fromArray->GetLength() ? length : (fromArray->GetLength() > start ? fromArray->GetLength() - start : 0);

            // length is the minimum of length, srcLength and dstLength
            length = length < srcLength ? (length < dstLength ? length : dstLength) : (srcLength < dstLength ? srcLength : dstLength);

            const size_t byteSize = sizeof(TypeName) * length;
            Assert(byteSize >= length); // check for overflow
            js_memcpy_s(dstBuffer + start, dstLength * sizeof(TypeName), srcBuffer + start, byteSize);

            if (dstLength > length)
            {
                TypeName undefinedValue = convFunc(GetLibrary()->GetUndefined(), GetScriptContext());
                for (uint32 i = length; i < dstLength; i++)
                {
                    dstBuffer[i] = undefinedValue;
                }
            }

            return true;
        }